

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setEnterBound4Col(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,int i,int n)

{
  double a;
  Status SVar1;
  pointer pnVar2;
  int32_t iVar3;
  long lVar4;
  pointer pnVar5;
  cpp_dec_float<200u,int,void> *pcVar6;
  uint *puVar7;
  pointer pnVar8;
  pointer pnVar9;
  uint *puVar10;
  long in_FS_OFFSET;
  byte bVar11;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined5 uStack_40;
  undefined3 uStack_3b;
  int iStack_38;
  bool bStack_34;
  undefined8 local_30;
  
  bVar11 = 0;
  SVar1 = (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.colstat.data[n];
  if (SVar1 == P_FIXED) {
    ::soplex::infinity::__tls_init();
    a = *(double *)(in_FS_OFFSET + -8);
    local_30 = 0x1c00000000;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    uStack_3b = 0;
    iStack_38 = 0;
    bStack_34 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_a8,-a);
    pnVar2 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar6 = (cpp_dec_float<200u,int,void> *)&local_a8;
    pnVar9 = pnVar2 + i;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = *(undefined4 *)pcVar6;
      pcVar6 = pcVar6 + (ulong)bVar11 * -8 + 4;
      pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar11 * -2 + 1) * 4);
    }
    pnVar2[i].m_backend.exp = iStack_38;
    pnVar2[i].m_backend.neg = bStack_34;
    pnVar2[i].m_backend.fpclass = (undefined4)local_30;
    pnVar2[i].m_backend.prec_elem = local_30._4_4_;
    ::soplex::infinity::__tls_init();
    local_30 = 0x1c00000000;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    uStack_3b = 0;
    iStack_38 = 0;
    bStack_34 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_a8,a);
    pnVar2 = (this->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar6 = (cpp_dec_float<200u,int,void> *)&local_a8;
    pnVar9 = pnVar2 + i;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = *(undefined4 *)pcVar6;
      pcVar6 = pcVar6 + (ulong)bVar11 * -8 + 4;
      pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar11 * -2 + 1) * 4);
    }
    pnVar2[i].m_backend.exp = iStack_38;
    pnVar2[i].m_backend.neg = bStack_34;
    pnVar2[i].m_backend.fpclass = (undefined4)local_30;
    pnVar2[i].m_backend.prec_elem = local_30._4_4_;
  }
  else if (SVar1 == P_ON_UPPER) {
    pnVar2 = (this->theLCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar9 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (uint *)(pnVar2 + n);
    puVar10 = (uint *)(pnVar9 + i);
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar10 = *puVar7;
      puVar7 = puVar7 + 1;
      puVar10 = puVar10 + 1;
    }
    pnVar9[i].m_backend.exp = pnVar2[n].m_backend.exp;
    pnVar9[i].m_backend.neg = pnVar2[n].m_backend.neg;
    iVar3 = pnVar2[n].m_backend.prec_elem;
    pnVar9[i].m_backend.fpclass = pnVar2[n].m_backend.fpclass;
    pnVar9[i].m_backend.prec_elem = iVar3;
    ::soplex::infinity::__tls_init();
    local_30 = 0x1c00000000;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    uStack_3b = 0;
    iStack_38 = 0;
    bStack_34 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_a8,*(double *)(in_FS_OFFSET + -8));
    pnVar2 = (this->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar6 = (cpp_dec_float<200u,int,void> *)&local_a8;
    pnVar9 = pnVar2 + i;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = *(undefined4 *)pcVar6;
      pcVar6 = pcVar6 + (ulong)bVar11 * -8 + 4;
      pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar11 * -2 + 1) * 4);
    }
    pnVar2[i].m_backend.exp = iStack_38;
    pnVar2[i].m_backend.neg = bStack_34;
    pnVar2[i].m_backend.fpclass = (undefined4)local_30;
    pnVar2[i].m_backend.prec_elem = local_30._4_4_;
  }
  else if (SVar1 == P_ON_LOWER) {
    ::soplex::infinity::__tls_init();
    local_30 = 0x1c00000000;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    uStack_3b = 0;
    iStack_38 = 0;
    bStack_34 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_a8,-*(double *)(in_FS_OFFSET + -8));
    pnVar2 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar6 = (cpp_dec_float<200u,int,void> *)&local_a8;
    pnVar9 = pnVar2 + i;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = *(undefined4 *)pcVar6;
      pcVar6 = pcVar6 + (ulong)bVar11 * -8 + 4;
      pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar11 * -2 + 1) * 4);
    }
    pnVar2[i].m_backend.exp = iStack_38;
    pnVar2[i].m_backend.neg = bStack_34;
    pnVar2[i].m_backend.fpclass = (undefined4)local_30;
    pnVar2[i].m_backend.prec_elem = local_30._4_4_;
    pnVar2 = (this->theUCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar9 = (this->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar5 = pnVar2 + n;
    pnVar8 = pnVar9 + i;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
      pnVar5 = (pointer)((long)pnVar5 + ((ulong)bVar11 * -2 + 1) * 4);
      pnVar8 = (pointer)((long)pnVar8 + ((ulong)bVar11 * -2 + 1) * 4);
    }
    pnVar9[i].m_backend.exp = pnVar2[n].m_backend.exp;
    pnVar9[i].m_backend.neg = pnVar2[n].m_backend.neg;
    iVar3 = pnVar2[n].m_backend.prec_elem;
    pnVar9[i].m_backend.fpclass = pnVar2[n].m_backend.fpclass;
    pnVar9[i].m_backend.prec_elem = iVar3;
  }
  else {
    pnVar2 = (this->theUCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar9 = (this->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (uint *)(pnVar2 + n);
    puVar10 = (uint *)(pnVar9 + i);
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar10 = *puVar7;
      puVar7 = puVar7 + 1;
      puVar10 = puVar10 + 1;
    }
    pnVar9[i].m_backend.exp = pnVar2[n].m_backend.exp;
    pnVar9[i].m_backend.neg = pnVar2[n].m_backend.neg;
    iVar3 = pnVar2[n].m_backend.prec_elem;
    pnVar9[i].m_backend.fpclass = pnVar2[n].m_backend.fpclass;
    pnVar9[i].m_backend.prec_elem = iVar3;
    pnVar2 = (this->theLCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar9 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (uint *)(pnVar2 + n);
    puVar10 = (uint *)(pnVar9 + i);
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar10 = *puVar7;
      puVar7 = puVar7 + 1;
      puVar10 = puVar10 + 1;
    }
    pnVar9[i].m_backend.exp = pnVar2[n].m_backend.exp;
    pnVar9[i].m_backend.neg = pnVar2[n].m_backend.neg;
    iVar3 = pnVar2[n].m_backend.prec_elem;
    pnVar9[i].m_backend.fpclass = pnVar2[n].m_backend.fpclass;
    pnVar9[i].m_backend.prec_elem = iVar3;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setEnterBound4Col(int i, int n)
{
   assert(this->baseId(i).isSPxColId());
   assert(this->number(SPxColId(this->baseId(i))) == n);

   switch(this->desc().colStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = theUCbound[n];
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = theLCbound[n];
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   default:
      theUBbound[i] = theUCbound[n];
      theLBbound[i] = theLCbound[n];
      break;
   }
}